

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint bit,Adaptive_Bit_Model *M)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (this->length >> 0xd) * M->bit_0_prob;
  if (bit == 0) {
    this->length = uVar5;
    M->bit_0_count = M->bit_0_count + 1;
  }
  else {
    uVar3 = this->length - uVar5;
    puVar1 = &this->base;
    uVar6 = *puVar1;
    *puVar1 = *puVar1 + uVar5;
    this->length = uVar3;
    if (!CARRY4(uVar6,uVar5)) goto LAB_003abb69;
    puVar4 = this->ac_pointer;
    while( true ) {
      puVar2 = puVar4 + -1;
      puVar4 = puVar4 + -1;
      if (*puVar2 != 0xff) break;
      *puVar4 = '\0';
    }
    *puVar4 = *puVar2 + '\x01';
  }
  uVar3 = this->length;
LAB_003abb69:
  if (uVar3 < 0x1000000) {
    uVar5 = this->base;
    do {
      puVar4 = this->ac_pointer;
      this->ac_pointer = puVar4 + 1;
      *puVar4 = (uchar)(uVar5 >> 0x18);
      uVar5 = this->base << 8;
      this->base = uVar5;
      uVar6 = this->length << 8;
      this->length = uVar6;
    } while (uVar6 < 0x1000000);
  }
  puVar1 = &M->bits_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  Adaptive_Bit_Model::update(M);
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned bit,
                                  Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        unsigned init_base = base;
        base   += x;
        length -= x;
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update
    }